

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O1

int * macro_arg_subst(Sym **nested_list,int *macro_str,Sym *args)

{
  char *pcVar1;
  char cVar2;
  undefined8 p;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  Sym *pSVar8;
  int *piVar9;
  uint *puVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int *macro_str_00;
  ulong uVar17;
  anon_union_8_2_ebb9b702_for_Sym_6 *ps;
  int iVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auStack_108 [8];
  TokenString str2;
  undefined1 auStack_b8 [8];
  TokenString str;
  undefined1 auStack_68 [8];
  CString cstr;
  undefined1 local_48 [8];
  CValue cval;
  
  auStack_b8 = (undefined1  [8])0x0;
  str.str = (int *)0x0;
  str.len = 0;
  str.lastlen = -1;
  uVar3 = 0;
  uVar20 = 0;
LAB_00125892:
  do {
    uVar17 = uVar3;
    puVar7 = (uint *)macro_str + 1;
    uVar14 = *macro_str;
    switch(uVar14) {
    case 0xb3:
    case 0xb4:
    case 0xb5:
    case 0xc0:
      local_48 = (undefined1  [8])(long)(int)((uint *)macro_str)[1];
      goto LAB_001258e0;
    case 0xb6:
      local_48 = (undefined1  [8])(ulong)((uint *)macro_str)[1];
LAB_001258e0:
      macro_str = (int *)((uint *)macro_str + 2);
      break;
    case 0xb7:
    case 0xb8:
    case 0xbc:
    case 0xce:
    case 0xcf:
      iVar18 = 2;
      goto LAB_001258bf;
    case 0xb9:
    case 0xba:
    case 0xbe:
    case 0xbf:
      cval.i = (uint64_t)((uint *)macro_str + 2);
      local_48._0_4_ = ((uint *)macro_str)[1];
      macro_str = (int *)((long)macro_str +
                         ((long)(int)((uint *)macro_str)[1] + 3U & 0xfffffffffffffffc) + 8);
      break;
    case 0xbb:
      puVar7 = (uint *)macro_str + 1;
      macro_str = (int *)((uint *)macro_str + 2);
      local_48._0_4_ = *puVar7;
      break;
    case 0xbd:
      iVar18 = 4;
LAB_001258bf:
      lVar19 = 0;
      do {
        *(undefined4 *)(local_48 + lVar19) = *(undefined4 *)((long)puVar7 + lVar19);
        lVar19 = lVar19 + 4;
      } while (iVar18 << 2 != (int)lVar19);
      puVar7 = (uint *)((long)puVar7 + lVar19);
switchD_001258b8_caseD_c1:
      macro_str = (int *)puVar7;
      break;
    default:
      goto switchD_001258b8_caseD_c1;
    }
    if (uVar14 == 0x23) {
      cstr._16_8_ = (uint *)macro_str + 1;
      uVar14 = *macro_str;
      switch(uVar14) {
      case 0xb3:
      case 0xb4:
      case 0xb5:
      case 0xc0:
        local_48 = (undefined1  [8])(long)(int)((uint *)macro_str)[1];
        goto LAB_00125c0e;
      case 0xb6:
        local_48 = (undefined1  [8])(ulong)((uint *)macro_str)[1];
LAB_00125c0e:
        cstr._16_8_ = (uint *)macro_str + 2;
        break;
      case 0xb7:
      case 0xb8:
      case 0xbc:
      case 0xce:
      case 0xcf:
        iVar18 = 2;
        goto LAB_00125b41;
      case 0xb9:
      case 0xba:
      case 0xbe:
      case 0xbf:
        cval.i = (uint64_t)((uint *)macro_str + 2);
        local_48._0_4_ = ((uint *)macro_str)[1];
        cstr._16_8_ = (long)macro_str +
                      ((long)(int)((uint *)macro_str)[1] + 3U & 0xfffffffffffffffc) + 8;
        break;
      case 0xbb:
        cstr._16_8_ = (uint *)macro_str + 2;
        local_48._0_4_ = ((uint *)macro_str)[1];
        break;
      case 0xbd:
        iVar18 = 4;
LAB_00125b41:
        lVar19 = 0;
        do {
          *(undefined4 *)(local_48 + lVar19) = *(undefined4 *)(cstr._16_8_ + lVar19);
          lVar19 = lVar19 + 4;
        } while (iVar18 << 2 != (int)lVar19);
        cstr._16_8_ = cstr._16_8_ + lVar19;
switchD_00125b3a_caseD_c1:
        break;
      default:
        goto switchD_00125b3a_caseD_c1;
      }
      if ((uVar14 == 0) || (pSVar8 = sym_find2(args,uVar14), pSVar8 == (Sym *)0x0)) {
        expect("macro parameter after \'#\'");
      }
      auStack_68 = (undefined1  [8])0x0;
      cstr.size = 0;
      cstr._4_4_ = 0;
      cstr.data = (void *)0x0;
      cstr._0_8_ = tal_realloc_impl(&cstr_alloc,(void *)0x0,8);
      cstr.data = (void *)CONCAT44(cstr.data._4_4_,8);
      *(undefined1 *)cstr._0_8_ = 0x22;
      auStack_68._0_4_ = 1;
      puVar7 = (uint *)(pSVar8->field_3).d;
      uVar16 = 0;
      uVar6 = *puVar7;
      while (uVar5 = uVar6, -1 < (int)uVar5) {
        puVar10 = puVar7 + 1;
        switch(uVar5) {
        case 0xb3:
        case 0xb4:
        case 0xb5:
        case 0xc0:
          local_48 = (undefined1  [8])(long)(int)puVar7[1];
          goto LAB_00125cf9;
        case 0xb6:
          local_48 = (undefined1  [8])(ulong)puVar7[1];
LAB_00125cf9:
          puVar7 = puVar7 + 2;
          break;
        case 0xb7:
        case 0xb8:
        case 0xbc:
        case 0xce:
        case 0xcf:
          iVar18 = 2;
          goto LAB_00125cd9;
        case 0xb9:
        case 0xba:
        case 0xbe:
        case 0xbf:
          cval.i = (uint64_t)(puVar7 + 2);
          local_48._0_4_ = puVar7[1];
          puVar7 = (uint *)((long)puVar7 + ((long)(int)puVar7[1] + 3U & 0xfffffffffffffffc) + 8);
          break;
        case 0xbb:
          puVar10 = puVar7 + 1;
          puVar7 = puVar7 + 2;
          local_48._0_4_ = *puVar10;
          break;
        case 0xbd:
          iVar18 = 4;
LAB_00125cd9:
          lVar19 = 0;
          do {
            *(undefined4 *)(local_48 + lVar19) = *(undefined4 *)((long)puVar10 + lVar19);
            lVar19 = lVar19 + 4;
          } while (iVar18 << 2 != (int)lVar19);
          puVar10 = (uint *)((long)puVar10 + lVar19);
switchD_00125cd2_caseD_c1:
          puVar7 = puVar10;
          break;
        default:
          goto switchD_00125cd2_caseD_c1;
        }
        if (uVar5 - 0xcd < 0xfffffffe) {
          if (uVar5 < 0x100) {
            uVar14 = isidnum_table[(ulong)uVar5 + 1] & 1;
            bVar4 = uVar16 == 0 || (isidnum_table[(ulong)uVar5 + 1] & 1) == 0;
          }
          else {
            bVar4 = true;
            uVar14 = 0;
          }
          uVar16 = uVar14;
          if (bVar4) {
            str._48_4_ = uVar14;
            pcVar11 = get_tok_str(uVar5,(CValue *)local_48);
            cVar2 = *pcVar11;
            iVar18 = auStack_68._0_4_;
            while (auStack_68._0_4_ = iVar18, cVar2 != '\0') {
              if (cVar2 == '\'' || uVar5 != 0xbf) {
                if ((int)(uint)cstr.data <= iVar18) {
                  uVar14 = (uint)cstr.data;
                  if ((int)(uint)cstr.data < 9) {
                    uVar14 = 8;
                  }
                  do {
                    uVar6 = uVar14;
                    uVar14 = uVar6 * 2;
                  } while ((int)uVar6 <= iVar18);
                  cstr._0_8_ = tal_realloc_impl(&cstr_alloc,(void *)cstr._0_8_,uVar6);
                  cstr.data = (void *)CONCAT44(cstr.data._4_4_,uVar6);
                }
                auStack_68._0_4_ = iVar18 + 1;
                *(char *)(cstr._0_8_ + (long)iVar18) = cVar2;
              }
              else {
                add_char((CString *)auStack_68,(int)cVar2);
              }
              pcVar1 = pcVar11 + 1;
              pcVar11 = pcVar11 + 1;
              iVar18 = auStack_68._0_4_;
              cVar2 = *pcVar1;
            }
            uVar16 = str._48_4_;
          }
        }
        uVar14 = uVar5;
        uVar6 = *puVar7;
      }
      lVar19 = (long)(int)auStack_68._0_4_;
      iVar18 = (int)(lVar19 - (int)uVar16);
      if ((int)(uint)cstr.data <= iVar18) {
        uVar6 = (uint)cstr.data;
        if ((int)(uint)cstr.data < 9) {
          uVar6 = 8;
        }
        do {
          uVar5 = uVar6;
          uVar6 = uVar5 * 2;
        } while ((int)uVar5 <= iVar18);
        auStack_68._0_4_ = iVar18;
        cstr._0_8_ = tal_realloc_impl(&cstr_alloc,(void *)cstr._0_8_,uVar5);
        cstr.data = (void *)CONCAT44(cstr.data._4_4_,uVar5);
      }
      *(undefined1 *)(cstr._0_8_ + (lVar19 - (int)uVar16)) = 0x22;
      auStack_68._0_4_ = (undefined4)((long)iVar18 + 1);
      if ((int)(uint)cstr.data <= (int)auStack_68._0_4_) {
        uVar6 = (uint)cstr.data;
        if ((int)(uint)cstr.data < 9) {
          uVar6 = 8;
        }
        do {
          uVar16 = uVar6;
          uVar6 = uVar16 * 2;
        } while ((int)uVar16 <= (int)auStack_68._0_4_);
        cstr._0_8_ = tal_realloc_impl(&cstr_alloc,(void *)cstr._0_8_,uVar16);
        cstr.data = (void *)CONCAT44(cstr.data._4_4_,uVar16);
      }
      p = cstr._0_8_;
      *(undefined1 *)(cstr._0_8_ + (long)iVar18 + 1) = 0;
      auStack_68._0_4_ = iVar18 + 2;
      local_48._0_4_ = iVar18 + 2;
      cval.d = (double)cstr._0_8_;
      tok_str_add2((TokenString *)auStack_b8,0xbf,(CValue *)local_48);
      tal_free_impl(cstr_alloc,(void *)p);
      auStack_68 = (undefined1  [8])0x0;
      cstr.size = 0;
      cstr._4_4_ = 0;
      cstr.data = (void *)0x0;
      uVar20 = uVar17 & 0xffffffff;
      macro_str = (int *)cstr._16_8_;
      uVar3 = (ulong)uVar14;
      goto LAB_00125892;
    }
    if (uVar14 == 0) {
      lVar19 = (long)(int)str.str;
      if (str.len <= (int)str.str) {
        iVar18 = 0x10;
        if (0x10 < str.len) {
          iVar18 = str.len;
        }
        do {
          iVar15 = iVar18;
          iVar18 = iVar15 * 2;
        } while (iVar15 <= (int)str.str);
        if (str.len < iVar15) {
          auStack_b8 = (undefined1  [8])
                       tal_realloc_impl(&tokstr_alloc,(void *)auStack_b8,iVar15 * 4);
        }
      }
      *(int *)((long)auStack_b8 + lVar19 * 4) = 0;
      return (int *)auStack_b8;
    }
    if ((int)uVar14 < 0x100) {
      tok_str_add2((TokenString *)auStack_b8,uVar14,(CValue *)local_48);
      uVar3 = (ulong)uVar14;
      uVar20 = uVar17 & 0xffffffff;
    }
    else {
      str._48_8_ = (ulong)uVar14;
      pSVar8 = sym_find2(args,uVar14);
      uVar3 = str._48_8_;
      iVar18 = (int)str.str;
      if (pSVar8 != (Sym *)0x0) {
        macro_str_00 = (pSVar8->field_3).d;
        cstr._16_8_ = macro_str;
        if (((int)uVar17 == 0xcd) || (*macro_str == 0xcd)) {
          if (((int)uVar17 != 0xcd) ||
             ((((int)uVar20 != 0x2c || (gnu_ext == 0)) || ((pSVar8->type).t == 0))))
          goto LAB_00125a68;
          if (*macro_str_00 < 1) {
            str.str = (int *)CONCAT44(str.str._4_4_,(int)str.str + -2);
            goto LAB_00125a68;
          }
          str.str = (int *)CONCAT44(str.str._4_4_,(int)str.str + -1);
        }
        ps = &pSVar8->field_5;
        if ((pSVar8->field_5).next == (Sym *)0x0) {
          sym_push2(&ps->next,pSVar8->v,(pSVar8->type).t,0);
          auStack_108 = (undefined1  [8])0x0;
          str2.str = (int *)0x0;
          str2.len = 0;
          str2.lastlen = -1;
          macro_subst((TokenString *)auStack_108,nested_list,macro_str_00);
          iVar15 = (int)str2.str;
          lVar19 = (long)(int)str2.str;
          if (str2.len <= (int)str2.str) {
            iVar13 = 0x10;
            if (0x10 < str2.len) {
              iVar13 = str2.len;
            }
            do {
              iVar12 = iVar13;
              iVar13 = iVar12 * 2;
            } while (iVar12 <= (int)str2.str);
            if (str2.len < iVar12) {
              auStack_108 = (undefined1  [8])
                            tal_realloc_impl(&tokstr_alloc,(void *)auStack_108,iVar12 * 4);
              str2.len = iVar12;
            }
          }
          *(int *)((long)auStack_108 + lVar19 * 4) = 0;
          str2.str = (int *)CONCAT44(str2.str._4_4_,iVar15 + 1);
          (ps->next->field_3).d = (int *)auStack_108;
        }
        macro_str_00 = *(int **)((long)*(Sym **)ps + 8);
LAB_00125a68:
        uVar3 = str._48_8_;
        do {
          macro_str = (int *)cstr._16_8_;
          piVar9 = macro_str_00 + 1;
          iVar15 = *macro_str_00;
          switch(iVar15) {
          case 0xb3:
          case 0xb4:
          case 0xb5:
          case 0xc0:
            local_48 = (undefined1  [8])(long)macro_str_00[1];
            goto LAB_00125aaf;
          case 0xb6:
            local_48 = (undefined1  [8])(ulong)(uint)macro_str_00[1];
LAB_00125aaf:
            piVar9 = macro_str_00 + 2;
            break;
          case 0xb7:
          case 0xb8:
          case 0xbc:
          case 0xce:
          case 0xcf:
            iVar13 = 2;
            goto LAB_00125a8e;
          case 0xb9:
          case 0xba:
          case 0xbe:
          case 0xbf:
            cval.i = (uint64_t)(macro_str_00 + 2);
            local_48._0_4_ = macro_str_00[1];
            piVar9 = (int *)((long)macro_str_00 +
                            ((long)macro_str_00[1] + 3U & 0xfffffffffffffffc) + 8);
            break;
          case 0xbb:
            piVar9 = macro_str_00 + 2;
            local_48._0_4_ = macro_str_00[1];
            break;
          case 0xbd:
            iVar13 = 4;
LAB_00125a8e:
            lVar19 = 0;
            do {
              *(undefined4 *)(local_48 + lVar19) = *(undefined4 *)((long)piVar9 + lVar19);
              lVar19 = lVar19 + 4;
            } while (iVar13 << 2 != (int)lVar19);
            piVar9 = (int *)((long)piVar9 + lVar19);
switchD_00125a87_caseD_c1:
            break;
          default:
            goto switchD_00125a87_caseD_c1;
          }
          if (iVar15 < 1) goto LAB_00125b7c;
          tok_str_add2((TokenString *)auStack_b8,iVar15,(CValue *)local_48);
          macro_str_00 = piVar9;
        } while( true );
      }
      lVar19 = (long)(int)str.str;
      if (str.len <= (int)str.str) {
        iVar15 = 0x10;
        if (0x10 < str.len) {
          iVar15 = str.len;
        }
        do {
          iVar13 = iVar15;
          iVar15 = iVar13 * 2;
        } while (iVar13 <= (int)str.str);
        if (str.len < iVar13) {
          auStack_b8 = (undefined1  [8])
                       tal_realloc_impl(&tokstr_alloc,(void *)auStack_b8,iVar13 * 4);
          str.len = iVar13;
        }
      }
      *(int *)((long)auStack_b8 + lVar19 * 4) = (int)uVar3;
      str.str = (int *)CONCAT44(str.str._4_4_,iVar18 + 1);
      uVar20 = uVar17 & 0xffffffff;
    }
  } while( true );
LAB_00125b7c:
  iVar15 = (int)str.str;
  lVar19 = (long)(int)str.str;
  uVar20 = uVar17 & 0xffffffff;
  if ((int)str.str == iVar18) {
    if (str.len <= (int)str.str) {
      iVar18 = 0x10;
      if (0x10 < str.len) {
        iVar18 = str.len;
      }
      do {
        iVar13 = iVar18;
        iVar18 = iVar13 * 2;
      } while (iVar13 <= (int)str.str);
      if (str.len < iVar13) {
        auStack_b8 = (undefined1  [8])tal_realloc_impl(&tokstr_alloc,(void *)auStack_b8,iVar13 * 4);
        str.len = iVar13;
      }
    }
    *(int *)((long)auStack_b8 + lVar19 * 4) = 0xcb;
    str.str = (int *)CONCAT44(str.str._4_4_,iVar15 + 1);
    uVar20 = uVar17 & 0xffffffff;
  }
  goto LAB_00125892;
}

Assistant:

static int* macro_arg_subst(Sym** nested_list, const int* macro_str, Sym* args) {
  int t, t0, t1, spc;
  const int* st;
  Sym* s;
  CValue cval;
  TokenString str;
  CString cstr;

  tok_str_new(&str);
  t0 = t1 = 0;
  while (1) {
    TOK_GET(&t, &macro_str, &cval);
    if (!t)
      break;
    if (t == '#') {
      /* stringize */
      TOK_GET(&t, &macro_str, &cval);
      if (!t)
        goto bad_stringy;
      s = sym_find2(args, t);
      if (s) {
        cstr_new(&cstr);
        cstr_ccat(&cstr, '\"');
        st = s->d;
        spc = 0;
        while (*st >= 0) {
          TOK_GET(&t, &st, &cval);
          if (t != TOK_PLCHLDR && t != TOK_NOSUBST && 0 == check_space(t, &spc)) {
            const char* s = get_tok_str(t, &cval);
            while (*s) {
              if (t == TOK_PPSTR && *s != '\'')
                add_char(&cstr, *s);
              else
                cstr_ccat(&cstr, *s);
              ++s;
            }
          }
        }
        cstr.size -= spc;
        cstr_ccat(&cstr, '\"');
        cstr_ccat(&cstr, '\0');
#ifdef PP_DEBUG
        printf("\nstringize: <%s>\n", (char*)cstr.data);
#endif
        /* add string */
        cval.str.size = cstr.size;
        cval.str.data = cstr.data;
        tok_str_add2(&str, TOK_PPSTR, &cval);
        cstr_free(&cstr);
      } else {
      bad_stringy:
        expect("macro parameter after '#'");
      }
    } else if (t >= TOK_IDENT) {
      s = sym_find2(args, t);
      if (s) {
        int l0 = str.len;
        st = s->d;
        /* if '##' is present before or after, no arg substitution */
        if (*macro_str == TOK_PPJOIN || t1 == TOK_PPJOIN) {
          /* special case for var arg macros : ## eats the ','
             if empty VA_ARGS variable. */
          if (t1 == TOK_PPJOIN && t0 == ',' && gnu_ext && s->type.t) {
            if (*st <= 0) {
              /* suppress ',' '##' */
              str.len -= 2;
            } else {
              /* suppress '##' and add variable */
              str.len--;
              goto add_var;
            }
          }
        } else {
        add_var:
          if (!s->next) {
            /* Expand arguments tokens and store them.  In most
               cases we could also re-expand each argument if
               used multiple times, but not if the argument
               contains the __COUNTER__ macro.  */
            TokenString str2;
            sym_push2(&s->next, s->v, s->type.t, 0);
            tok_str_new(&str2);
            macro_subst(&str2, nested_list, st);
            tok_str_add(&str2, 0);
            s->next->d = str2.str;
          }
          st = s->next->d;
        }
        for (;;) {
          int t2;
          TOK_GET(&t2, &st, &cval);
          if (t2 <= 0)
            break;
          tok_str_add2(&str, t2, &cval);
        }
        if (str.len == l0) /* expanded to empty string */
          tok_str_add(&str, TOK_PLCHLDR);
      } else {
        tok_str_add(&str, t);
      }
    } else {
      tok_str_add2(&str, t, &cval);
    }
    t0 = t1, t1 = t;
  }
  tok_str_add(&str, 0);
  return str.str;
}